

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_construct(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  size_t sVar2;
  int k_1;
  int k;
  bitset_t *b;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  bitset = bitset_create();
  for (iVar3 = 0; iVar3 < 1000; iVar3 = iVar3 + 1) {
    bitset_set((bitset_t *)CONCAT44(iVar3,in_stack_fffffffffffffff0),
               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  sVar2 = bitset_count((bitset_t *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
  if (sVar2 != 1000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_construct",0x34);
    exit(1);
  }
  iVar3 = 0;
  while( true ) {
    if (2999 < iVar3) {
      bitset_free((bitset_t *)0x1015b5);
      return;
    }
    _Var1 = bitset_get(bitset,(long)iVar3);
    if (_Var1 != ((iVar3 / 3) * 3 == iVar3)) break;
    iVar3 = iVar3 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_construct",0x36);
  exit(1);
}

Assistant:

void test_construct() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  for (int k = 0; k < 3 * 1000; ++k)
    TEST_ASSERT(bitset_get(b, k) == (k / 3 * 3 == k));
  bitset_free(b);
}